

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O1

AFM_Token afm_tokenize(char *key,FT_Offset len)

{
  char cVar1;
  int iVar2;
  AFM_Token AVar3;
  AFM_Token AVar4;
  char **ppcVar5;
  AFM_Token AVar6;
  
  cVar1 = *key;
  AVar3 = AFM_TOKEN_ASCENDER;
  do {
    AVar4 = AVar3;
    if (*afm_key_table[(int)AVar3] == cVar1) {
      AVar6 = AFM_TOKEN_XHEIGHT;
      if (0x49 < (int)AVar3) {
        AVar6 = AVar3;
      }
      ppcVar5 = afm_key_table + (int)AVar3;
      do {
        if (**ppcVar5 != cVar1) {
          return AFM_TOKEN_UNKNOWN;
        }
        iVar2 = strncmp(*ppcVar5,key,len);
        if (iVar2 == 0) {
          return AVar4;
        }
        AVar4 = AVar4 + AFM_TOKEN_AXISLABEL;
        ppcVar5 = ppcVar5 + 1;
      } while (AVar6 + AFM_TOKEN_AXISLABEL != AVar4);
    }
    AVar3 = AVar4 + AFM_TOKEN_AXISLABEL;
    if (0x48 < (int)AVar4) {
      return AFM_TOKEN_UNKNOWN;
    }
  } while( true );
}

Assistant:

static AFM_Token
  afm_tokenize( const char*  key,
                FT_Offset    len )
  {
    int  n;


    for ( n = 0; n < N_AFM_TOKENS; n++ )
    {
      if ( *( afm_key_table[n] ) == *key )
      {
        for ( ; n < N_AFM_TOKENS; n++ )
        {
          if ( *( afm_key_table[n] ) != *key )
            return AFM_TOKEN_UNKNOWN;

          if ( ft_strncmp( afm_key_table[n], key, len ) == 0 )
            return (AFM_Token) n;
        }
      }
    }

    return AFM_TOKEN_UNKNOWN;
  }